

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O1

tmsize_t TIFFReadRawStripOrTile2
                   (TIFF *tif,uint32_t strip_or_tile,int is_strip,tmsize_t size,char *module)

{
  int iVar1;
  uint64_t off;
  ulong uVar2;
  
  if ((tif->tif_flags >> 0xb & 1) != 0) {
    __assert_fail("!isMapped(tif)",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                  ,0x295,
                  "tmsize_t TIFFReadRawStripOrTile2(TIFF *, uint32_t, int, tmsize_t, const char *)")
    ;
  }
  if ((tif->tif_flags >> 0x11 & 1) == 0) {
    off = TIFFGetStrileOffset(tif,strip_or_tile);
    iVar1 = _TIFFSeekOK(tif,off);
    if (iVar1 == 0) {
      if (is_strip == 0) {
        TIFFErrorExtR(tif,module,"Seek error at row %u, col %u, tile %u",(ulong)tif->tif_row,
                      (ulong)tif->tif_col,strip_or_tile);
      }
      else {
        TIFFErrorExtR(tif,module,"Seek error at scanline %u, strip %u",(ulong)tif->tif_row,
                      strip_or_tile);
      }
      uVar2 = 0xffffffffffffffff;
    }
    else {
      iVar1 = TIFFReadAndRealloc(tif,size,0,is_strip,strip_or_tile,module);
      uVar2 = -(ulong)(iVar1 == 0) | size;
    }
    return uVar2;
  }
  __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                ,0x296,
                "tmsize_t TIFFReadRawStripOrTile2(TIFF *, uint32_t, int, tmsize_t, const char *)");
}

Assistant:

static tmsize_t TIFFReadRawStripOrTile2(TIFF *tif, uint32_t strip_or_tile,
                                        int is_strip, tmsize_t size,
                                        const char *module)
{
    assert(!isMapped(tif));
    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);

    if (!SeekOK(tif, TIFFGetStrileOffset(tif, strip_or_tile)))
    {
        if (is_strip)
        {
            TIFFErrorExtR(tif, module,
                          "Seek error at scanline %" PRIu32 ", strip %" PRIu32,
                          tif->tif_row, strip_or_tile);
        }
        else
        {
            TIFFErrorExtR(tif, module,
                          "Seek error at row %" PRIu32 ", col %" PRIu32
                          ", tile %" PRIu32,
                          tif->tif_row, tif->tif_col, strip_or_tile);
        }
        return ((tmsize_t)(-1));
    }

    if (!TIFFReadAndRealloc(tif, size, 0, is_strip, strip_or_tile, module))
    {
        return ((tmsize_t)(-1));
    }

    return (size);
}